

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

bool __thiscall
chaiscript::Type_Conversions::converts(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *psVar1;
  size_type sVar2;
  bool bVar3;
  type_info *local_40;
  type_info *local_38;
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *local_30;
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *types;
  Type_Info *from_local;
  Type_Info *to_local;
  Type_Conversions *this_local;
  
  types = (set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
           *)from;
  from_local = to;
  to_local = (Type_Info *)this;
  psVar1 = thread_cache(this);
  local_30 = psVar1;
  local_38 = Type_Info::bare_type_info(from_local);
  sVar2 = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::count(psVar1,&local_38);
  psVar1 = local_30;
  bVar3 = false;
  if (sVar2 != 0) {
    local_40 = Type_Info::bare_type_info((Type_Info *)types);
    sVar2 = std::
            set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
            ::count(psVar1,&local_40);
    bVar3 = sVar2 != 0;
  }
  if (bVar3) {
    this_local._7_1_ = has_conversion(this,from_local,(Type_Info *)types);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool converts(const Type_Info &to, const Type_Info &from) const noexcept {
      const auto &types = thread_cache();
      if (types.count(to.bare_type_info()) != 0 && types.count(from.bare_type_info()) != 0) {
        return has_conversion(to, from);
      } else {
        return false;
      }
    }